

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

microseconds __thiscall
RandomMixin<FastRandomContext>::rand_exp_duration
          (RandomMixin<FastRandomContext> *this,microseconds mean)

{
  long lVar1;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> _Var2;
  long in_FS_OFFSET;
  double unscaled;
  RandomMixin<FastRandomContext> *in_stack_ffffffffffffff68;
  undefined2 in_stack_ffffffffffffff70;
  undefined2 uVar3;
  undefined6 in_stack_ffffffffffffff72;
  undefined2 in_stack_ffffffffffffff78;
  FastRandomContext *in_stack_ffffffffffffff80;
  duration<double,_std::ratio<1L,_1000000L>_> *in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Impl(in_stack_ffffffffffffff68);
  FastRandomContext::rand64(in_stack_ffffffffffffff80);
  MakeExponentiallyDistributed((uint64_t)in_stack_ffffffffffffff68);
  std::chrono::operator*
            ((double *)CONCAT62(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70),
             (duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_ffffffffffffff68);
  uVar3 = (undefined2)((unkuint10)(longdouble)0.5 >> 0x40);
  us((longdouble)CONCAT28(in_stack_ffffffffffffff78,CONCAT62(in_stack_ffffffffffffff72,uVar3)));
  std::chrono::operator+
            (in_stack_ffffffffffffff88,
             (duration<long_double,_std::ratio<1L,_1000000L>_> *)in_stack_ffffffffffffff80);
  _Var2 = std::chrono::
          duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long_double,std::ratio<1l,1000000l>>
                    ((duration<long_double,_std::ratio<1L,_1000000L>_> *)
                     CONCAT62(in_stack_ffffffffffffff72,uVar3));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (microseconds)_Var2.__r;
  }
  __stack_chk_fail();
}

Assistant:

std::chrono::microseconds rand_exp_duration(std::chrono::microseconds mean) noexcept
    {
        using namespace std::chrono_literals;
        auto unscaled = MakeExponentiallyDistributed(Impl().rand64());
        return std::chrono::duration_cast<std::chrono::microseconds>(unscaled * mean + 0.5us);
    }